

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void increment(char *s)

{
  size_t sVar1;
  char *in_RDI;
  int i;
  int local_c;
  
  sVar1 = strlen(in_RDI);
  local_c = (int)sVar1;
  while( true ) {
    local_c = local_c + -1;
    if (local_c < 0) {
      return;
    }
    if (in_RDI[local_c] != '9') break;
    in_RDI[local_c] = '0';
  }
  in_RDI[local_c] = in_RDI[local_c] + '\x01';
  return;
}

Assistant:

void increment(char *s) {
  for (int i = static_cast<int>(std::strlen(s)) - 1; i >= 0; --i) {
    if (s[i] != '9') {
      ++s[i];
      break;
    }
    s[i] = '0';
  }
}